

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SnapshotBuffer.cpp
# Opt level: O0

void __thiscall cali::SnapshotBuffer::append(SnapshotBuffer *this,CompressedSnapshotRecord *rec)

{
  size_t sVar1;
  uchar *puVar2;
  uchar *__src;
  size_t sVar3;
  CompressedSnapshotRecord *rec_local;
  SnapshotBuffer *this_local;
  
  sVar3 = this->m_pos;
  sVar1 = CompressedSnapshotRecord::size(rec);
  puVar2 = reserve(this,sVar3 + sVar1);
  sVar3 = this->m_pos;
  __src = CompressedSnapshotRecord::data(rec);
  sVar1 = CompressedSnapshotRecord::size(rec);
  memcpy(puVar2 + sVar3,__src,sVar1);
  sVar3 = CompressedSnapshotRecord::size(rec);
  this->m_pos = sVar3 + this->m_pos;
  this->m_count = this->m_count + 1;
  return;
}

Assistant:

void SnapshotBuffer::append(const CompressedSnapshotRecord& rec)
{
    memcpy(reserve(m_pos + rec.size()) + m_pos, rec.data(), rec.size());

    m_pos += rec.size();
    ++m_count;
}